

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_u(bitstream *str,uint32_t *val,int size)

{
  int iVar1;
  uint local_2c;
  int local_28;
  uint32_t bit;
  int i;
  int size_local;
  uint32_t *val_local;
  bitstream *str_local;
  
  if (str->dir == VS_DECODE) {
    *val = 0;
  }
  local_28 = 0;
  bit = size;
  _i = val;
  val_local = &str->dir;
  while( true ) {
    if ((int)bit <= local_28) {
      return 0;
    }
    local_2c = *_i >> (((char)bit + -1) - (char)local_28 & 0x1fU) & 1;
    iVar1 = vs_bit((bitstream *)val_local,&local_2c);
    if (iVar1 != 0) break;
    *_i = *_i | local_2c << (~(byte)local_28 + (char)bit & 0x1f);
    if (val_local[0xb] == 0) {
      if (0xe < (int)val_local[10]) {
        fprintf(_stderr,"Too many zero bits in a row\n");
        return 1;
      }
    }
    else if ((val_local[0xb] == 2) && (0xf < (int)val_local[10])) {
      fprintf(_stderr,"Too many zero bits in a row\n");
      return 1;
    }
    local_28 = local_28 + 1;
  }
  return 1;
}

Assistant:

int vs_u(struct bitstream *str, uint32_t *val, int size) {
	int i;
	uint32_t bit;
	if (str->dir == VS_DECODE)
		*val = 0;
	for (i = 0; i < size; i++) {
		bit = *val >> (size - 1 - i) & 1;
		if (vs_bit(str, &bit)) return 1;
		*val |= bit << (size - 1 - i);
		switch (str->type) {
			case VS_H261:
				if (str->zero_bits >= 15) {
					fprintf(stderr, "Too many zero bits in a row\n");
					return 1;
				}
				break;
			case VS_H263:
				if (str->zero_bits >= 16) {
					fprintf(stderr, "Too many zero bits in a row\n");
					return 1;
				}
				break;
			default:
				break;
		}
	}
	return 0;
}